

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanics.c
# Opt level: O0

void mc_wrench_invert(mc_wrench *f,mc_wrench *r,int count)

{
  int count_local;
  mc_wrench *r_local;
  mc_wrench *f_local;
  
  if (f == (mc_wrench *)0x0) {
    __assert_fail("f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x7c,"void mc_wrench_invert(const struct mc_wrench *, struct mc_wrench *, int)");
  }
  if (r != (mc_wrench *)0x0) {
    la_dscal_o(count * 3,-1.0,(double *)f->torque,1,(double *)r->torque,1);
    la_dscal_o(count * 3,-1.0,(double *)f->force,1,(double *)r->force,1);
    return;
  }
  __assert_fail("r",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                ,0x7d,"void mc_wrench_invert(const struct mc_wrench *, struct mc_wrench *, int)");
}

Assistant:

void mc_wrench_invert(
        const struct mc_wrench *f,
        struct mc_wrench *r,
        int count)
{
    assert(f);
    assert(r);

    la_dscal_o(3 * count, -1.0, (double *)f->torque, 1, (double *)r->torque, 1);
    la_dscal_o(3 * count, -1.0, (double *)f->force, 1, (double *)r->force, 1);
}